

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

void create_hostcache_id(char *name,int port,char *ptr,size_t buflen)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = strlen(name);
  if (sVar2 != 0) {
    sVar3 = 0xff;
    if (sVar2 < 0xff) {
      sVar3 = sVar2;
    }
    sVar2 = 0;
    do {
      cVar1 = Curl_raw_tolower(name[sVar2]);
      ptr[sVar2] = cVar1;
      sVar2 = sVar2 + 1;
    } while (sVar3 != sVar2);
    ptr = ptr + sVar2;
  }
  curl_msnprintf(ptr,7,":%u",port);
  return;
}

Assistant:

static void
create_hostcache_id(const char *name, int port, char *ptr, size_t buflen)
{
  size_t len = strlen(name);
  if(len > (buflen - 7))
    len = buflen - 7;
  /* store and lower case the name */
  while(len--)
    *ptr++ = Curl_raw_tolower(*name++);
  msnprintf(ptr, 7, ":%u", port);
}